

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O1

void BinaryCache::Terminate(void)

{
  void *pvVar1;
  ulong uVar2;
  long lVar3;
  
  if (DAT_0042ef3c != 0) {
    uVar2 = 0;
    do {
      (*(code *)NULLC::dealloc)(*(undefined8 *)(importPaths + uVar2 * 8));
      uVar2 = uVar2 + 1;
    } while (uVar2 < _DAT_0042ef38 >> 0x20);
  }
  _DAT_0042ef38 = _DAT_0042ef38 & 0xffffffff;
  if (importPaths != 0) {
    (*(code *)NULLC::dealloc)();
  }
  importPaths = 0;
  _DAT_0042ef38 = 0;
  if (DAT_0042ef2c != 0) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      (*(code *)NULLC::dealloc)(*(undefined8 *)(cache + lVar3));
      if (uRam000000000042ef28 >> 0x20 <= uVar2) {
LAB_002452f1:
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x7f,
                      "T &FastVector<BinaryCache::CodeDescriptor>::operator[](unsigned int) [T = BinaryCache::CodeDescriptor, zeroNewMemory = false, skipConstructor = false]"
                     );
      }
      pvVar1 = *(void **)(cache + 0x10 + lVar3);
      if (pvVar1 != (void *)0x0) {
        operator_delete__(pvVar1);
      }
      if (uRam000000000042ef28 >> 0x20 <= uVar2) goto LAB_002452f1;
      pvVar1 = *(void **)(cache + 0x18 + lVar3);
      if (pvVar1 != (void *)0x0) {
        operator_delete__(pvVar1);
      }
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x28;
    } while (uVar2 < uRam000000000042ef28 >> 0x20);
  }
  uRam000000000042ef28 = uRam000000000042ef28 & 0xffffffff;
  if (cache != 0) {
    (*(code *)NULLC::dealloc)();
  }
  cache = 0;
  uRam000000000042ef28 = 0;
  if (lastBytecode != (void *)0x0) {
    operator_delete__(lastBytecode);
  }
  lastBytecode = (void *)0x0;
  return;
}

Assistant:

void BinaryCache::ClearImportPaths()
{
	for(unsigned int i = 0; i < importPaths.size(); i++)
		NULLC::dealloc(importPaths[i]);
	importPaths.clear();
}